

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

uint64_t __thiscall FFFBFFFDReader::size(FFFBFFFDReader *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer ppVar3;
  element_type *peVar4;
  undefined4 extraout_var_00;
  undefined1 local_48 [16];
  areainfo lastblock;
  FFFBFFFDReader *this_local;
  
  lastblock.nblocks = (size_t)this;
  bVar1 = std::
          map<unsigned_int,_FFFBFFFDReader::areainfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_FFFBFFFDReader::areainfo>_>_>
          ::empty(&this->_areamap);
  if (bVar1) {
    printf("note: fffbfffd filesize not yet accurately known\n");
    peVar4 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->_r);
    iVar2 = (*peVar4->_vptr_ReadWriter[6])();
    this_local = (FFFBFFFDReader *)
                 ((CONCAT44(extraout_var,iVar2) / (ulong)(this->_blocksize + 8)) *
                 (ulong)this->_blocksize);
  }
  else {
    std::
    map<unsigned_int,_FFFBFFFDReader::areainfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_FFFBFFFDReader::areainfo>_>_>
    ::rbegin((map<unsigned_int,_FFFBFFFDReader::areainfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_FFFBFFFDReader::areainfo>_>_>
              *)local_48);
    ppVar3 = std::
             reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_FFFBFFFDReader::areainfo>_>_>
             ::operator->((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_FFFBFFFDReader::areainfo>_>_>
                           *)local_48);
    memcpy(local_48 + 8,&ppVar3->second,0x28);
    peVar4 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->_r);
    iVar2 = (*peVar4->_vptr_ReadWriter[6])();
    this_local = (FFFBFFFDReader *)
                 (((ulong)(CONCAT44(extraout_var_00,iVar2) - lastblock._0_8_) /
                   (ulong)(this->_blocksize + 8) + (ulong)(uint)lastblock.fileoffset) *
                 (ulong)this->_blocksize);
  }
  return (uint64_t)this_local;
}

Assistant:

virtual uint64_t size()
    {
        if (_areamap.empty()) {
            printf("note: fffbfffd filesize not yet accurately known\n");
            return (_r->size()/(_blocksize+8))*_blocksize;
        }
        auto lastblock= _areamap.rbegin()->second;
        return ((_r->size()-lastblock.fileoffset)/(_blocksize+8)+lastblock.firstblock)*_blocksize;
    }